

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_block_invoke<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  pointer psVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (0xc < (long)last - (long)first) {
    pcVar3 = first + 0xd;
    lVar2 = 0;
    do {
      if (first[lVar2] != "_block_invoke"[lVar2]) {
        return first;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xd);
    pcVar4 = pcVar3;
    if (pcVar3 != last) {
      if (*pcVar3 == '_') {
        if (first + 0xe == last) {
          return first;
        }
        if (9 < (int)first[0xe] - 0x30U) {
          return first;
        }
        pcVar3 = first + 0xf;
        pcVar4 = pcVar3;
      }
      for (; (pcVar3 != last && (pcVar4 = pcVar3, (int)*pcVar3 - 0x30U < 10)); pcVar3 = pcVar3 + 1)
      {
        pcVar4 = last;
      }
    }
    psVar1 = (db->names).
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar1) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::replace(&psVar1[-1].first,0,0,"invocation function for block in ",0x21);
      first = pcVar4;
    }
  }
  return first;
}

Assistant:

const char*
parse_block_invoke(const char* first, const char* last, C& db)
{
    if (last - first >= 13)
    {
        const char test[] = "_block_invoke";
        const char* t = first;
        for (int i = 0; i < 13; ++i, ++t)
        {
            if (*t != test[i])
                return first;
        }
        if (t != last)
        {
            if (*t == '_')
            {
                // must have at least 1 decimal digit
                if (++t == last || !std::isdigit(*t))
                    return first;
                ++t;
            }
            // parse zero or more digits
            while (t != last && isdigit(*t))
                ++t;
        }
        if (db.names.empty())
            return first;
        db.names.back().first.insert(0, "invocation function for block in ");
        first = t;
    }
    return first;
}